

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::Coroutine<kj::HttpInputStream::Message>::fulfill
          (Coroutine<kj::HttpInputStream::Message> *this,
          FixVoid<kj::HttpInputStream::Message> *value)

{
  ExceptionOr<kj::HttpInputStream::Message> local_1c0;
  
  if ((this->super_CoroutineBase).waiting == true) {
    local_1c0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1c0.value.ptr.isSet = true;
    local_1c0.value.ptr.field_1.value.headers = value->headers;
    local_1c0.value.ptr.field_1.value.body.disposer = (value->body).disposer;
    local_1c0.value.ptr.field_1.value.body.ptr = (value->body).ptr;
    (value->body).ptr = (AsyncInputStream *)0x0;
    ExceptionOr<kj::HttpInputStream::Message>::operator=(&this->result,&local_1c0);
    ExceptionOr<kj::HttpInputStream::Message>::~ExceptionOr(&local_1c0);
    CoroutineBase::scheduleResumption(&this->super_CoroutineBase);
  }
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) {
    // Called by the return_value()/return_void() functions in our mixin class.

    if (isWaiting()) {
      result = kj::mv(value);
      scheduleResumption();
    }
  }